

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__encode_half_float_linear_AR(void *outputp,int width_times_channels,float *encode)

{
  undefined1 (*pauVar1) [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 (*pauVar7) [16];
  float *pfVar8;
  stbir__FP16 *output;
  undefined1 (*pauVar9) [16];
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar25;
  float fVar27;
  float fVar29;
  undefined1 auVar23 [16];
  float fVar26;
  float fVar28;
  float fVar30;
  undefined1 auVar24 [16];
  
  auVar6 = _DAT_005ecd40;
  pauVar1 = (undefined1 (*) [16])((long)outputp + (long)width_times_channels * 2);
  if (width_times_channels < 8) {
    pauVar9 = (undefined1 (*) [16])outputp;
    if (3 < width_times_channels) {
      do {
        outputp = (void *)((long)*pauVar9 + 8);
        fVar22 = ABS(encode[1]);
        if ((uint)fVar22 < 0x47800000) {
          if ((uint)fVar22 < 0x38800000) {
            fVar26 = fVar22 + 0.5;
          }
          else {
            fVar22 = (float)((int)fVar22 + 0x8000fff + (uint)(((uint)fVar22 >> 0xd & 1) != 0) >> 0xd
                            );
            fVar26 = fVar22;
          }
        }
        else {
          fVar26 = (float)((0x7f800000 < (uint)fVar22 | 0x3e) << 9);
        }
        iVar10 = movmskps(fVar22,ZEXT416((uint)encode[1]));
        *(ushort *)*pauVar9 = (ushort)(iVar10 << 0xf) | SUB42(fVar26,0);
        fVar22 = ABS(*encode);
        if ((uint)fVar22 < 0x47800000) {
          if ((uint)fVar22 < 0x38800000) {
            fVar26 = fVar22 + 0.5;
          }
          else {
            fVar22 = (float)((int)fVar22 + 0x8000fff + (uint)(((uint)fVar22 >> 0xd & 1) != 0) >> 0xd
                            );
            fVar26 = fVar22;
          }
        }
        else {
          fVar26 = (float)((0x7f800000 < (uint)fVar22 | 0x3e) << 9);
        }
        iVar10 = movmskps(fVar22,ZEXT416((uint)*encode));
        *(ushort *)((long)*pauVar9 + 2) = (ushort)(iVar10 << 0xf) | SUB42(fVar26,0);
        fVar22 = ABS(encode[3]);
        if ((uint)fVar22 < 0x47800000) {
          if ((uint)fVar22 < 0x38800000) {
            fVar26 = fVar22 + 0.5;
          }
          else {
            fVar22 = (float)((int)fVar22 + 0x8000fff + (uint)(((uint)fVar22 >> 0xd & 1) != 0) >> 0xd
                            );
            fVar26 = fVar22;
          }
        }
        else {
          fVar26 = (float)((0x7f800000 < (uint)fVar22 | 0x3e) << 9);
        }
        iVar10 = movmskps(fVar22,ZEXT416((uint)encode[3]));
        *(ushort *)((long)*pauVar9 + 4) = (ushort)(iVar10 << 0xf) | SUB42(fVar26,0);
        fVar22 = ABS(encode[2]);
        if ((uint)fVar22 < 0x47800000) {
          if ((uint)fVar22 < 0x38800000) {
            fVar26 = fVar22 + 0.5;
          }
          else {
            fVar22 = (float)((int)fVar22 + 0x8000fff + (uint)(((uint)fVar22 >> 0xd & 1) != 0) >> 0xd
                            );
            fVar26 = fVar22;
          }
        }
        else {
          fVar26 = (float)((0x7f800000 < (uint)fVar22 | 0x3e) << 9);
        }
        iVar10 = movmskps(fVar22,ZEXT416((uint)encode[2]));
        *(ushort *)((long)*pauVar9 + 6) = (ushort)(iVar10 << 0xf) | SUB42(fVar26,0);
        encode = encode + 4;
        pauVar7 = pauVar9 + 1;
        pauVar9 = (undefined1 (*) [16])outputp;
      } while (pauVar7 <= pauVar1);
    }
    if (outputp < pauVar1) {
      pfVar8 = encode + 1;
      do {
        fVar22 = ABS(*pfVar8);
        if ((uint)fVar22 < 0x47800000) {
          if ((uint)fVar22 < 0x38800000) {
            fVar26 = fVar22 + 0.5;
          }
          else {
            fVar22 = (float)((int)fVar22 + 0x8000fff + (uint)(((uint)fVar22 >> 0xd & 1) != 0) >> 0xd
                            );
            fVar26 = fVar22;
          }
        }
        else {
          fVar26 = (float)((0x7f800000 < (uint)fVar22 | 0x3e) << 9);
        }
        iVar10 = movmskps(fVar22,ZEXT416((uint)*pfVar8));
        *(ushort *)*(undefined1 (*) [16])outputp = (ushort)(iVar10 << 0xf) | SUB42(fVar26,0);
        fVar22 = ABS(pfVar8[-1]);
        if ((uint)fVar22 < 0x47800000) {
          if ((uint)fVar22 < 0x38800000) {
            fVar26 = fVar22 + 0.5;
          }
          else {
            fVar22 = (float)((int)fVar22 + 0x8000fff + (uint)(((uint)fVar22 >> 0xd & 1) != 0) >> 0xd
                            );
            fVar26 = fVar22;
          }
        }
        else {
          fVar26 = (float)((0x7f800000 < (uint)fVar22 | 0x3e) << 9);
        }
        iVar10 = movmskps(fVar22,ZEXT416((uint)pfVar8[-1]));
        *(ushort *)((long)*(undefined1 (*) [16])outputp + 2) =
             (ushort)(iVar10 << 0xf) | SUB42(fVar26,0);
        outputp = (void *)((long)*(undefined1 (*) [16])outputp + 4);
        pfVar8 = pfVar8 + 2;
      } while (outputp < pauVar1);
    }
  }
  else {
    pfVar8 = encode;
    do {
      do {
        fVar22 = *pfVar8;
        fVar26 = pfVar8[1];
        fVar28 = pfVar8[2];
        fVar30 = pfVar8[3];
        fVar2 = pfVar8[4];
        fVar3 = pfVar8[5];
        fVar4 = pfVar8[6];
        fVar5 = pfVar8[7];
        fVar21 = ABS(fVar26);
        fVar25 = ABS(fVar22);
        fVar27 = ABS(fVar30);
        fVar29 = ABS(fVar28);
        auVar14._0_4_ = -(uint)(-0x47800001 < (int)((uint)fVar21 | 0x80000000));
        auVar14._4_4_ = -(uint)(-0x47800001 < (int)((uint)fVar25 | 0x80000000));
        auVar14._8_4_ = -(uint)(-0x47800001 < (int)((uint)fVar27 | 0x80000000));
        auVar14._12_4_ = -(uint)(-0x47800001 < (int)((uint)fVar29 | 0x80000000));
        auVar17._0_4_ = (int)(fVar21 + 0.5) + -0x3f000000;
        auVar17._4_4_ = (int)(fVar25 + 0.5) + -0x3f000000;
        auVar17._8_4_ = (int)(fVar27 + 0.5) + -0x3f000000;
        auVar17._12_4_ = (int)(fVar29 + 0.5) + -0x3f000000;
        auVar23._0_4_ = (int)fVar21 + -0x37fff001 + ((uint)fVar21 >> 0xd & 1) >> 0xd;
        auVar23._4_4_ = (int)fVar25 + -0x37fff001 + ((uint)fVar25 >> 0xd & 1) >> 0xd;
        auVar23._8_4_ = (int)fVar27 + -0x37fff001 + ((uint)fVar27 >> 0xd & 1) >> 0xd;
        auVar23._12_4_ = (int)fVar29 + -0x37fff001 + ((uint)fVar29 >> 0xd & 1) >> 0xd;
        auVar19._0_4_ = -(uint)(-0x38800001 < (int)((uint)fVar21 | 0x80000000));
        auVar19._4_4_ = -(uint)(-0x38800001 < (int)((uint)fVar25 | 0x80000000));
        auVar19._8_4_ = -(uint)(-0x38800001 < (int)((uint)fVar27 | 0x80000000));
        auVar19._12_4_ = -(uint)(-0x38800001 < (int)((uint)fVar29 | 0x80000000));
        auVar11._0_4_ = (-(uint)NAN(fVar26) & 0x200 | 0x7c00) & auVar19._0_4_;
        auVar11._4_4_ = (-(uint)NAN(fVar22) & 0x200 | 0x7c00) & auVar19._4_4_;
        auVar11._8_4_ = (-(uint)NAN(fVar30) & 0x200 | 0x7c00) & auVar19._8_4_;
        auVar11._12_4_ = (-(uint)NAN(fVar28) & 0x200 | 0x7c00) & auVar19._12_4_;
        auVar16._0_4_ = (int)fVar26 >> 0x10;
        auVar16._4_4_ = (int)fVar22 >> 0x10;
        auVar16._8_4_ = (int)fVar30 >> 0x10;
        auVar16._12_4_ = (int)fVar28 >> 0x10;
        fVar22 = ABS(fVar3);
        fVar26 = ABS(fVar2);
        fVar28 = ABS(fVar5);
        fVar30 = ABS(fVar4);
        auVar15._0_4_ = -(uint)(-0x47800001 < (int)((uint)fVar22 | 0x80000000));
        auVar15._4_4_ = -(uint)(-0x47800001 < (int)((uint)fVar26 | 0x80000000));
        auVar15._8_4_ = -(uint)(-0x47800001 < (int)((uint)fVar28 | 0x80000000));
        auVar15._12_4_ = -(uint)(-0x47800001 < (int)((uint)fVar30 | 0x80000000));
        auVar12._0_4_ = (int)(fVar22 + 0.5) + -0x3f000000;
        auVar12._4_4_ = (int)(fVar26 + 0.5) + -0x3f000000;
        auVar12._8_4_ = (int)(fVar28 + 0.5) + -0x3f000000;
        auVar12._12_4_ = (int)(fVar30 + 0.5) + -0x3f000000;
        auVar24._0_4_ = (int)fVar22 + -0x37fff001 + ((uint)fVar22 >> 0xd & 1) >> 0xd;
        auVar24._4_4_ = (int)fVar26 + -0x37fff001 + ((uint)fVar26 >> 0xd & 1) >> 0xd;
        auVar24._8_4_ = (int)fVar28 + -0x37fff001 + ((uint)fVar28 >> 0xd & 1) >> 0xd;
        auVar24._12_4_ = (int)fVar30 + -0x37fff001 + ((uint)fVar30 >> 0xd & 1) >> 0xd;
        auVar20._0_4_ = -(uint)(-0x38800001 < (int)((uint)fVar22 | 0x80000000));
        auVar20._4_4_ = -(uint)(-0x38800001 < (int)((uint)fVar26 | 0x80000000));
        auVar20._8_4_ = -(uint)(-0x38800001 < (int)((uint)fVar28 | 0x80000000));
        auVar20._12_4_ = -(uint)(-0x38800001 < (int)((uint)fVar30 | 0x80000000));
        auVar13._0_4_ = (-(uint)NAN(fVar3) & 0x200 | 0x7c00) & auVar20._0_4_;
        auVar13._4_4_ = (-(uint)NAN(fVar2) & 0x200 | 0x7c00) & auVar20._4_4_;
        auVar13._8_4_ = (-(uint)NAN(fVar5) & 0x200 | 0x7c00) & auVar20._8_4_;
        auVar13._12_4_ = (-(uint)NAN(fVar4) & 0x200 | 0x7c00) & auVar20._12_4_;
        auVar18._0_4_ = (int)fVar3 >> 0x10;
        auVar18._4_4_ = (int)fVar2 >> 0x10;
        auVar18._8_4_ = (int)fVar5 >> 0x10;
        auVar18._12_4_ = (int)fVar4 >> 0x10;
        auVar17 = packssdw(auVar16 & auVar6 | auVar11 |
                           ~auVar19 & (~auVar14 & auVar17 | auVar23 & auVar14),
                           auVar18 & auVar6 | auVar13 |
                           ~auVar20 & (~auVar15 & auVar12 | auVar24 & auVar15));
        *(undefined1 (*) [16])outputp = auVar17;
        pauVar9 = (undefined1 (*) [16])((long)outputp + 0x10);
        pfVar8 = pfVar8 + 8;
        outputp = pauVar9;
      } while (pauVar9 <= pauVar1 + -1);
      pfVar8 = encode + (long)width_times_channels + -8;
      outputp = pauVar1 + -1;
    } while (pauVar9 != pauVar1);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_half_float_linear )( void * outputp, int width_times_channels, float const * encode )
{
  stbir__FP16 STBIR_SIMD_STREAMOUT_PTR( * ) output = (stbir__FP16*) outputp;
  stbir__FP16 * end_output = ( (stbir__FP16*) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= 8 )
  {
    float const * end_encode_m8 = encode + width_times_channels - 8;
    end_output -= 8;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      STBIR_SIMD_NO_UNROLL(encode);
      #ifdef stbir__decode_swizzle
      #ifdef STBIR_SIMD8
      {
        stbir__simdf8 of;
        stbir__simdf8_load( of, encode );
        stbir__encode_simdf8_unflip( of );
        stbir__float_to_half_SIMD( output, (float*)&of );
      }
      #else
      {
        stbir__simdf of[2];
        stbir__simdf_load( of[0], encode );
        stbir__simdf_load( of[1], encode+4 );
        stbir__encode_simdf4_unflip( of[0] );
        stbir__encode_simdf4_unflip( of[1] );
        stbir__float_to_half_SIMD( output, (float*)of );
      }
      #endif
      #else
      stbir__float_to_half_SIMD( output, encode );
      #endif
      encode += 8;
      output += 8;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 8 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    STBIR_SIMD_NO_UNROLL(output);
    output[0-4] = stbir__float_to_half(encode[stbir__encode_order0]);
    output[1-4] = stbir__float_to_half(encode[stbir__encode_order1]);
    output[2-4] = stbir__float_to_half(encode[stbir__encode_order2]);
    output[3-4] = stbir__float_to_half(encode[stbir__encode_order3]);
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    STBIR_NO_UNROLL(output);
    output[0] = stbir__float_to_half(encode[stbir__encode_order0]);
    #if stbir__coder_min_num >= 2
    output[1] = stbir__float_to_half(encode[stbir__encode_order1]);
    #endif
    #if stbir__coder_min_num >= 3
    output[2] = stbir__float_to_half(encode[stbir__encode_order2]);
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}